

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_contains_any_cb_iterate(map m,map_key key,map_value value,map_cb_iterate_args args)

{
  int iVar1;
  long in_RCX;
  map_key in_RSI;
  map in_RDI;
  map_contains_any_cb_iterator iterator;
  
  iVar1 = map_contains(in_RDI,in_RSI);
  *(int *)(in_RCX + 8) = iVar1;
  return (int)((*(int *)(in_RCX + 8) != 0 ^ 0xffU) & 1);
}

Assistant:

static int map_contains_any_cb_iterate(map m, map_key key, map_value value, map_cb_iterate_args args)
{
	map_contains_any_cb_iterator iterator = (map_contains_any_cb_iterator)args;

	(void)m;
	(void)value;

	iterator->result = map_contains(iterator->m, key);

	/* Stop iteration if we found an element */
	return !iterator->result;
}